

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::
TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this,void **vtt,TPZCompMesh *cmesh)

{
  void *pvVar1;
  
  TPZStructMatrix::TPZStructMatrix((TPZStructMatrix *)this,vtt + 3,cmesh);
  pvVar1 = vtt[2];
  *(void **)&(this->
             super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = pvVar1;
  *(void **)(&(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[6];
  *(void **)(&(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0x0 +
            *(long *)(*(long *)&(this->
                                super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                                ).super_TPZStructMatrixT<std::complex<double>_>.
                                super_TPZStructMatrix + -0x68)) = vtt[7];
  TPZStructMatrixOT<std::complex<double>_>::TPZStructMatrixOT
            ((TPZStructMatrixOT<std::complex<double>_> *)
             &(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0,
             vtt + 8);
  pvVar1 = vtt[1];
  *(void **)&(this->
             super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = pvVar1;
  *(void **)(&(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[0xb];
  *(void **)(&(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0x0 +
            *(long *)(*(long *)&(this->
                                super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                                ).super_TPZStructMatrixT<std::complex<double>_>.
                                super_TPZStructMatrix + -0x68)) = vtt[0xc];
  *(void **)&(this->
             super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0 =
       vtt[0xd];
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations.fStore = (long *)0x0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations.fNElements = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations.fNAlloc = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination.fStore = (long *)0x0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination.fNElements = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination.fNAlloc = 0;
  pvVar1 = *vtt;
  *(void **)&(this->
             super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = pvVar1;
  *(void **)(&(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[0xe];
  *(void **)(&(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0x0 +
            *(long *)(*(long *)&(this->
                                super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                                ).super_TPZStructMatrixT<std::complex<double>_>.
                                super_TPZStructMatrix + -0x68)) = vtt[0xf];
  *(void **)&(this->
             super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0 =
       vtt[0x10];
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}